

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iuutil::CmpHelperNeCollections<int*,int*>
          (AssertionResult *__return_storage_ptr__,iuutil *this,char *expr1b,char *expr1e,
          char *expr2b,char *expr2e,int *b1,int *e1,int *b2,int *e2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  char *local_a0;
  AssertionResult local_98;
  undefined4 local_70;
  undefined1 local_60 [8];
  AssertionResult ar;
  int *b1_local;
  char *expr2e_local;
  char *expr2b_local;
  char *expr1e_local;
  char *expr1b_local;
  
  ar._32_8_ = expr2e;
  b1_local = (int *)expr2b;
  expr2e_local = expr1e;
  expr2b_local = expr1b;
  expr1e_local = (char *)this;
  expr1b_local = (char *)__return_storage_ptr__;
  CmpHelperNeIterator<int*,int*>
            ((AssertionResult *)local_60,(iuutil *)expr2e,b1,e1,b2,(int *)expr2e);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (bVar1) {
    iutest::AssertionSuccess();
  }
  else {
    iutest::AssertionFailure();
    pAVar2 = iutest::AssertionResult::operator<<(&local_98,(char (*) [20])"error: Expected: { ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&expr1e_local);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [3])0x32e0f8);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&expr2b_local);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [9])" } != { ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&expr2e_local);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [3])0x32e0f8);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char **)&b1_local);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [13])" }\n  Actual:");
    local_a0 = iutest::GetAssertionResultMessage((AssertionResult *)local_60);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&local_a0);
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    iutest::AssertionResult::~AssertionResult(&local_98);
  }
  local_70 = 1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  return __return_storage_ptr__;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNeCollections(const char* expr1b, const char* expr1e
    , const char* expr2b, const char* expr2e
    , T1 b1, T1 e1, T2 b2, T2 e2)
{
    if( ::iutest::AssertionResult ar = CmpHelperNeIterator(b1, e1, b2, e2) )
    {
        return ::iutest::AssertionSuccess();
    }
    else
    {
        return ::iutest::AssertionFailure() << "error: Expected: { " << expr1b << ", " << expr1e << " } != { "
            << expr2b << ", " << expr2e << " }\n  Actual:" << GetAssertionResultMessage(ar);
    }
}